

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::Tokenizer::NextWithComments
          (Tokenizer *this,string *prev_trailing_comments,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments,string *next_leading_comments)

{
  bool bVar1;
  NextCommentStatus NVar2;
  string *psVar3;
  bool result;
  string local_a8;
  int local_78;
  int local_74;
  int trailing_comment_end_line;
  int prev_line;
  CommentCollector collector;
  string *next_leading_comments_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *detached_comments_local;
  string *prev_trailing_comments_local;
  Tokenizer *this_local;
  
  collector._56_8_ = next_leading_comments;
  anon_unknown_0::CommentCollector::CommentCollector
            ((CommentCollector *)&trailing_comment_end_line,prev_trailing_comments,detached_comments
             ,next_leading_comments);
  local_74 = this->line_;
  local_78 = -1;
  if ((this->current_).type == TYPE_START) {
    bVar1 = TryConsume(this,-0x11);
    if ((!bVar1) ||
       ((bVar1 = TryConsume(this,-0x45), bVar1 && (bVar1 = TryConsume(this,-0x41), bVar1)))) {
      anon_unknown_0::CommentCollector::DetachFromPrev
                ((CommentCollector *)&trailing_comment_end_line);
      local_74 = -1;
      goto switchD_003eae51_default;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,
               "Proto file starts with 0xEF but not UTF-8 BOM. Only UTF-8 is accepted for proto file."
               ,(allocator<char> *)&result);
    AddError(this,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&result);
    this_local._7_1_ = false;
    goto LAB_003eb034;
  }
  ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
  NVar2 = TryConsumeCommentStart(this);
  switch(NVar2) {
  case LINE_COMMENT:
    local_78 = this->line_;
    psVar3 = (anonymous_namespace)::CommentCollector::GetBufferForLineComment_abi_cxx11_
                       ((CommentCollector *)&trailing_comment_end_line);
    ConsumeLineComment(this,psVar3);
    anon_unknown_0::CommentCollector::Flush((CommentCollector *)&trailing_comment_end_line);
    break;
  case BLOCK_COMMENT:
    psVar3 = (anonymous_namespace)::CommentCollector::GetBufferForBlockComment_abi_cxx11_
                       ((CommentCollector *)&trailing_comment_end_line);
    ConsumeBlockComment(this,psVar3);
    local_78 = this->line_;
    ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
    anon_unknown_0::CommentCollector::Flush((CommentCollector *)&trailing_comment_end_line);
    break;
  case SLASH_NOT_COMMENT:
    this_local._7_1_ = true;
    goto LAB_003eb034;
  case NO_COMMENT:
    bVar1 = TryConsume(this,'\n');
    if (bVar1) break;
    this_local._7_1_ = Next(this);
LAB_003eb034:
    anon_unknown_0::CommentCollector::~CommentCollector
              ((CommentCollector *)&trailing_comment_end_line);
    return this_local._7_1_;
  }
switchD_003eae51_default:
  do {
    ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
    NVar2 = TryConsumeCommentStart(this);
    switch(NVar2) {
    case LINE_COMMENT:
      psVar3 = (anonymous_namespace)::CommentCollector::GetBufferForLineComment_abi_cxx11_
                         ((CommentCollector *)&trailing_comment_end_line);
      ConsumeLineComment(this,psVar3);
      break;
    case BLOCK_COMMENT:
      psVar3 = (anonymous_namespace)::CommentCollector::GetBufferForBlockComment_abi_cxx11_
                         ((CommentCollector *)&trailing_comment_end_line);
      ConsumeBlockComment(this,psVar3);
      ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
      TryConsume(this,'\n');
      break;
    case SLASH_NOT_COMMENT:
      goto switchD_003eae51_caseD_2;
    case NO_COMMENT:
      bVar1 = TryConsume(this,'\n');
      if (!bVar1) {
        this_local._7_1_ = Next(this);
        if ((((!this_local._7_1_) || (bVar1 = std::operator==(&(this->current_).text,"}"), bVar1))
            || (bVar1 = std::operator==(&(this->current_).text,"]"), bVar1)) ||
           (bVar1 = std::operator==(&(this->current_).text,")"), bVar1)) {
          anon_unknown_0::CommentCollector::Flush((CommentCollector *)&trailing_comment_end_line);
        }
        if ((this_local._7_1_) && ((local_74 == this->line_ || (local_78 == this->line_)))) {
          anon_unknown_0::CommentCollector::MaybeDetachComment
                    ((CommentCollector *)&trailing_comment_end_line);
        }
        goto LAB_003eb034;
      }
      anon_unknown_0::CommentCollector::Flush((CommentCollector *)&trailing_comment_end_line);
      anon_unknown_0::CommentCollector::DetachFromPrev
                ((CommentCollector *)&trailing_comment_end_line);
    }
  } while( true );
switchD_003eae51_caseD_2:
  this_local._7_1_ = true;
  goto LAB_003eb034;
}

Assistant:

bool Tokenizer::NextWithComments(std::string* prev_trailing_comments,
                                 std::vector<std::string>* detached_comments,
                                 std::string* next_leading_comments) {
  CommentCollector collector(prev_trailing_comments, detached_comments,
                             next_leading_comments);

  int prev_line = line_;
  int trailing_comment_end_line = -1;

  if (current_.type == TYPE_START) {
    // Ignore unicode byte order mark(BOM) if it appears at the file
    // beginning. Only UTF-8 BOM (0xEF 0xBB 0xBF) is accepted.
    if (TryConsume(static_cast<char>(0xEF))) {
      if (!TryConsume(static_cast<char>(0xBB)) ||
          !TryConsume(static_cast<char>(0xBF))) {
        AddError(
            "Proto file starts with 0xEF but not UTF-8 BOM. "
            "Only UTF-8 is accepted for proto file.");
        return false;
      }
    }
    collector.DetachFromPrev();
    prev_line = -1;
  } else {
    // A comment appearing on the same line must be attached to the previous
    // declaration.
    ConsumeZeroOrMore<WhitespaceNoNewline>();
    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        trailing_comment_end_line = line_;
        ConsumeLineComment(collector.GetBufferForLineComment());

        // Don't allow comments on subsequent lines to be attached to a trailing
        // comment.
        collector.Flush();
        break;
      case BLOCK_COMMENT:
        ConsumeBlockComment(collector.GetBufferForBlockComment());
        trailing_comment_end_line = line_;
        ConsumeZeroOrMore<WhitespaceNoNewline>();

        // Don't allow comments on subsequent lines to be attached to a trailing
        // comment.
        collector.Flush();
        break;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        if (!TryConsume('\n')) {
          // The next token is on the same line.  There are no comments.
          return Next();
        }
        break;
    }
  }

  // OK, we are now on the line *after* the previous token.
  while (true) {
    ConsumeZeroOrMore<WhitespaceNoNewline>();

    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(collector.GetBufferForLineComment());
        break;
      case BLOCK_COMMENT:
        ConsumeBlockComment(collector.GetBufferForBlockComment());

        // Consume the rest of the line so that we don't interpret it as a
        // blank line the next time around the loop.
        ConsumeZeroOrMore<WhitespaceNoNewline>();
        TryConsume('\n');
        break;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        if (TryConsume('\n')) {
          // Completely blank line.
          collector.Flush();
          collector.DetachFromPrev();
        } else {
          bool result = Next();
          if (!result || current_.text == "}" || current_.text == "]" ||
              current_.text == ")") {
            // It looks like we're at the end of a scope.  In this case it
            // makes no sense to attach a comment to the following token.
            collector.Flush();
          }
          if (result &&
              (prev_line == line_ || trailing_comment_end_line == line_)) {
            // When previous token and this one are on the same line, or
            // even if a multi-line trailing comment ends on the same line
            // as this token, it's unclear to what token the comment
            // should be attached. So we detach it.
            collector.MaybeDetachComment();
          }
          return result;
        }
        break;
    }
  }
}